

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O2

void anon_unknown.dwarf_12607ce::sha256::TransformD64(uchar *out,uchar *in)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  uint32_t b_00;
  uint32_t uVar18;
  uint32_t uVar19;
  uint32_t uVar20;
  uint32_t uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint32_t a_00;
  uint32_t uVar51;
  uint32_t uVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  uint uVar58;
  int iVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  uint32_t e_00;
  uint uVar64;
  uint uVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  uint uVar69;
  long in_FS_OFFSET;
  uint32_t h;
  uint32_t g;
  uint32_t f;
  uint32_t e;
  uint32_t d;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  a = 0x6a09e667;
  b = 0xbb67ae85;
  c = 0x3c6ef372;
  d = 0xa54ff53a;
  e = 0x510e527f;
  f = 0x9b05688c;
  g = 0x1f83d9ab;
  h = 0x5be0cd19;
  uVar22 = *(uint *)in;
  uVar28 = uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 | uVar22 << 0x18;
  Round(0x6a09e667,0xbb67ae85,0x3c6ef372,&d,0x510e527f,0x9b05688c,0x1f83d9ab,&h,uVar28 + 0x428a2f98)
  ;
  uVar51 = d;
  uVar11 = h;
  uVar22 = *(uint *)(in + 4);
  uVar58 = uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8;
  uVar29 = uVar58 | uVar22 << 0x18;
  Round(h,0x6a09e667,0xbb67ae85,&c,d,0x510e527f,0x9b05688c,&g,uVar29 + 0x71374491);
  uVar14 = c;
  uVar12 = g;
  uVar23 = *(uint *)(in + 8);
  uVar60 = uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 | (uVar23 & 0xff00) << 8;
  uVar30 = uVar60 | uVar23 << 0x18;
  Round(g,uVar11,0x6a09e667,&b,c,uVar51,0x510e527f,&f,uVar30 + 0xb5c0fbcf);
  uVar52 = b;
  uVar13 = f;
  uVar24 = *(uint *)(in + 0xc);
  uVar61 = uVar24 >> 0x18 | (uVar24 & 0xff0000) >> 8 | (uVar24 & 0xff00) << 8;
  uVar31 = uVar61 | uVar24 << 0x18;
  Round(f,uVar12,uVar11,&a,b,uVar14,uVar51,&e,uVar31 + 0xe9b5dba5);
  uVar15 = a;
  uVar51 = e;
  uVar25 = *(uint *)(in + 0x10);
  uVar62 = uVar25 >> 0x18 | (uVar25 & 0xff0000) >> 8 | (uVar25 & 0xff00) << 8;
  uVar32 = uVar62 | uVar25 << 0x18;
  Round(e,uVar13,uVar12,&h,a,uVar52,uVar14,&d,uVar32 + 0x3956c25b);
  uVar14 = d;
  uVar11 = h;
  uVar26 = *(uint *)(in + 0x14);
  uVar63 = uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 | (uVar26 & 0xff00) << 8;
  uVar33 = uVar63 | uVar26 << 0x18;
  Round(d,uVar51,uVar13,&g,h,uVar15,uVar52,&c,uVar33 + 0x59f111f1);
  uVar52 = c;
  uVar12 = g;
  uVar27 = *(uint *)(in + 0x18);
  uVar69 = uVar27 >> 0x18 | (uVar27 & 0xff0000) >> 8 | (uVar27 & 0xff00) << 8;
  uVar34 = uVar69 | uVar27 << 0x18;
  Round(c,uVar14,uVar51,&f,g,uVar11,uVar15,&b,uVar34 + 0x923f82a4);
  uVar15 = b;
  uVar13 = f;
  uVar42 = *(uint *)(in + 0x1c);
  uVar2 = uVar42 >> 0x18 | (uVar42 & 0xff0000) >> 8 | (uVar42 & 0xff00) << 8;
  uVar35 = uVar2 | uVar42 << 0x18;
  Round(b,uVar52,uVar14,&e,f,uVar12,uVar11,&a,uVar35 + 0xab1c5ed5);
  uVar16 = a;
  uVar51 = e;
  uVar43 = *(uint *)(in + 0x20);
  uVar3 = uVar43 >> 0x18 | (uVar43 & 0xff0000) >> 8 | (uVar43 & 0xff00) << 8;
  uVar36 = uVar3 | uVar43 << 0x18;
  Round(a,uVar15,uVar52,&d,e,uVar13,uVar12,&h,uVar36 + 0xd807aa98);
  uVar14 = d;
  uVar11 = h;
  uVar44 = *(uint *)(in + 0x24);
  uVar4 = uVar44 >> 0x18 | (uVar44 & 0xff0000) >> 8 | (uVar44 & 0xff00) << 8;
  uVar37 = uVar4 | uVar44 << 0x18;
  Round(h,uVar16,uVar15,&c,d,uVar51,uVar13,&g,uVar37 + 0x12835b01);
  uVar52 = c;
  uVar12 = g;
  uVar45 = *(uint *)(in + 0x28);
  uVar5 = uVar45 >> 0x18 | (uVar45 & 0xff0000) >> 8 | (uVar45 & 0xff00) << 8;
  uVar38 = uVar5 | uVar45 << 0x18;
  Round(g,uVar11,uVar16,&b,c,uVar14,uVar51,&f,uVar38 + 0x243185be);
  uVar15 = b;
  uVar13 = f;
  uVar46 = *(uint *)(in + 0x2c);
  uVar6 = uVar46 >> 0x18 | (uVar46 & 0xff0000) >> 8 | (uVar46 & 0xff00) << 8;
  uVar39 = uVar6 | uVar46 << 0x18;
  Round(f,uVar12,uVar11,&a,b,uVar52,uVar14,&e,uVar39 + 0x550c7dc3);
  uVar16 = a;
  uVar51 = e;
  uVar47 = *(uint *)(in + 0x30);
  uVar7 = uVar47 >> 0x18 | (uVar47 & 0xff0000) >> 8 | (uVar47 & 0xff00) << 8;
  uVar40 = uVar7 | uVar47 << 0x18;
  Round(e,uVar13,uVar12,&h,a,uVar15,uVar52,&d,uVar40 + 0x72be5d74);
  uVar14 = d;
  uVar11 = h;
  uVar48 = *(uint *)(in + 0x34);
  uVar8 = uVar48 >> 0x18 | (uVar48 & 0xff0000) >> 8 | (uVar48 & 0xff00) << 8;
  uVar41 = uVar8 | uVar48 << 0x18;
  Round(d,uVar51,uVar13,&g,h,uVar16,uVar15,&c,uVar41 + 0x80deb1fe);
  uVar52 = c;
  uVar12 = g;
  uVar49 = *(uint *)(in + 0x38);
  uVar9 = uVar49 >> 0x18 | (uVar49 & 0xff0000) >> 8 | (uVar49 & 0xff00) << 8;
  uVar64 = uVar9 | uVar49 << 0x18;
  Round(c,uVar14,uVar51,&f,g,uVar11,uVar16,&b,uVar64 + 0x9bdc06a7);
  uVar15 = b;
  uVar13 = f;
  uVar50 = *(uint *)(in + 0x3c);
  uVar10 = uVar50 >> 0x18 | (uVar50 & 0xff0000) >> 8 | (uVar50 & 0xff00) << 8;
  uVar65 = uVar10 | uVar50 << 0x18;
  Round(b,uVar52,uVar14,&e,f,uVar12,uVar11,&a,uVar65 + 0xc19bf174);
  uVar16 = a;
  uVar51 = e;
  uVar58 = uVar28 + uVar37 +
           (uVar29 >> 3 ^
           (uVar58 << 0xe | uVar29 >> 0x12) ^ ((uVar22 >> 0x18) << 0x19 | uVar29 >> 7)) +
           (uVar64 >> 10 ^ (uVar9 << 0xd | uVar64 >> 0x13) ^ (uVar9 << 0xf | uVar64 >> 0x11));
  Round(a,uVar15,uVar52,&d,e,uVar13,uVar12,&h,uVar58 + 0xe49b69c1);
  uVar14 = d;
  uVar11 = h;
  uVar22 = uVar65 >> 10 ^ (uVar10 << 0xd | uVar65 >> 0x13) ^ (uVar10 << 0xf | uVar65 >> 0x11);
  iVar59 = uVar29 + uVar38 +
           (uVar30 >> 3 ^
           (uVar60 << 0xe | uVar30 >> 0x12) ^ ((uVar23 >> 0x18) << 0x19 | uVar30 >> 7));
  uVar28 = iVar59 + uVar22;
  Round(h,uVar16,uVar15,&c,d,uVar51,uVar13,&g,uVar22 + iVar59 + 0xefbe4786);
  uVar52 = c;
  uVar12 = g;
  uVar60 = uVar30 + uVar39 +
           (uVar31 >> 3 ^
           (uVar61 << 0xe | uVar31 >> 0x12) ^ ((uVar24 >> 0x18) << 0x19 | uVar31 >> 7)) +
           (uVar58 >> 10 ^ (uVar58 * 0x2000 | uVar58 >> 0x13) ^ (uVar58 * 0x8000 | uVar58 >> 0x11));
  Round(g,uVar11,uVar16,&b,c,uVar14,uVar51,&f,uVar60 + 0xfc19dc6);
  uVar15 = b;
  uVar13 = f;
  uVar61 = uVar31 + uVar40 +
           (uVar32 >> 3 ^
           (uVar62 << 0xe | uVar32 >> 0x12) ^ ((uVar25 >> 0x18) << 0x19 | uVar32 >> 7)) +
           (uVar28 >> 10 ^ (uVar28 * 0x2000 | uVar28 >> 0x13) ^ (uVar28 * 0x8000 | uVar28 >> 0x11));
  Round(f,uVar12,uVar11,&a,b,uVar52,uVar14,&e,uVar61 + 0x240ca1cc);
  uVar16 = a;
  uVar51 = e;
  uVar62 = uVar32 + uVar41 +
           (uVar33 >> 3 ^
           (uVar63 << 0xe | uVar33 >> 0x12) ^ ((uVar26 >> 0x18) << 0x19 | uVar33 >> 7)) +
           (uVar60 >> 10 ^ (uVar60 * 0x2000 | uVar60 >> 0x13) ^ (uVar60 * 0x8000 | uVar60 >> 0x11));
  Round(e,uVar13,uVar12,&h,a,uVar15,uVar52,&d,uVar62 + 0x2de92c6f);
  uVar14 = d;
  uVar11 = h;
  uVar63 = uVar33 + uVar64 +
           (uVar34 >> 3 ^
           (uVar69 << 0xe | uVar34 >> 0x12) ^ ((uVar27 >> 0x18) << 0x19 | uVar34 >> 7)) +
           (uVar61 >> 10 ^ (uVar61 * 0x2000 | uVar61 >> 0x13) ^ (uVar61 * 0x8000 | uVar61 >> 0x11));
  Round(d,uVar51,uVar13,&g,h,uVar16,uVar15,&c,uVar63 + 0x4a7484aa);
  uVar52 = c;
  uVar12 = g;
  uVar23 = uVar62 >> 10 ^ (uVar62 * 0x2000 | uVar62 >> 0x13) ^ (uVar62 * 0x8000 | uVar62 >> 0x11);
  iVar59 = uVar34 + uVar65 +
           (uVar35 >> 3 ^ (uVar2 << 0xe | uVar35 >> 0x12) ^ ((uVar42 >> 0x18) << 0x19 | uVar35 >> 7)
           );
  uVar22 = iVar59 + uVar23;
  Round(c,uVar14,uVar51,&f,g,uVar11,uVar16,&b,uVar23 + iVar59 + 0x5cb0a9dc);
  uVar15 = b;
  uVar13 = f;
  uVar24 = uVar63 >> 10 ^ (uVar63 * 0x2000 | uVar63 >> 0x13) ^ (uVar63 * 0x8000 | uVar63 >> 0x11);
  iVar59 = (uVar36 >> 3 ^ (uVar3 << 0xe | uVar36 >> 0x12) ^ ((uVar43 >> 0x18) << 0x19 | uVar36 >> 7)
           ) + uVar35 + uVar58;
  uVar23 = iVar59 + uVar24;
  Round(b,uVar52,uVar14,&e,f,uVar12,uVar11,&a,uVar24 + iVar59 + 0x76f988da);
  uVar16 = a;
  uVar51 = e;
  uVar25 = uVar22 >> 10 ^ (uVar22 * 0x2000 | uVar22 >> 0x13) ^ (uVar22 * 0x8000 | uVar22 >> 0x11);
  iVar59 = (uVar37 >> 3 ^ (uVar4 << 0xe | uVar37 >> 0x12) ^ ((uVar44 >> 0x18) << 0x19 | uVar37 >> 7)
           ) + uVar36 + uVar28;
  uVar24 = iVar59 + uVar25;
  Round(a,uVar15,uVar52,&d,e,uVar13,uVar12,&h,uVar25 + iVar59 + 0x983e5152);
  uVar14 = d;
  uVar11 = h;
  uVar42 = (uVar38 >> 3 ^ (uVar5 << 0xe | uVar38 >> 0x12) ^ ((uVar45 >> 0x18) << 0x19 | uVar38 >> 7)
           ) + uVar37 + uVar60 +
           (uVar23 >> 10 ^ (uVar23 * 0x2000 | uVar23 >> 0x13) ^ (uVar23 * 0x8000 | uVar23 >> 0x11));
  Round(h,uVar16,uVar15,&c,d,uVar51,uVar13,&g,uVar42 + 0xa831c66d);
  uVar52 = c;
  uVar12 = g;
  uVar43 = (uVar39 >> 3 ^ (uVar6 << 0xe | uVar39 >> 0x12) ^ ((uVar46 >> 0x18) << 0x19 | uVar39 >> 7)
           ) + uVar38 + uVar61 +
           (uVar24 >> 10 ^ (uVar24 * 0x2000 | uVar24 >> 0x13) ^ (uVar24 * 0x8000 | uVar24 >> 0x11));
  Round(g,uVar11,uVar16,&b,c,uVar14,uVar51,&f,uVar43 + 0xb00327c8);
  uVar15 = b;
  uVar13 = f;
  uVar44 = (uVar40 >> 3 ^ (uVar7 << 0xe | uVar40 >> 0x12) ^ ((uVar47 >> 0x18) << 0x19 | uVar40 >> 7)
           ) + uVar39 + uVar62 +
           (uVar42 >> 10 ^ (uVar42 * 0x2000 | uVar42 >> 0x13) ^ (uVar42 * 0x8000 | uVar42 >> 0x11));
  Round(f,uVar12,uVar11,&a,b,uVar52,uVar14,&e,uVar44 + 0xbf597fc7);
  uVar16 = a;
  uVar51 = e;
  uVar45 = (uVar41 >> 3 ^ (uVar8 << 0xe | uVar41 >> 0x12) ^ ((uVar48 >> 0x18) << 0x19 | uVar41 >> 7)
           ) + uVar40 + uVar63 +
           (uVar43 >> 10 ^ (uVar43 * 0x2000 | uVar43 >> 0x13) ^ (uVar43 * 0x8000 | uVar43 >> 0x11));
  Round(e,uVar13,uVar12,&h,a,uVar15,uVar52,&d,uVar45 + 0xc6e00bf3);
  uVar14 = d;
  uVar11 = h;
  uVar46 = (uVar64 >> 3 ^ (uVar9 << 0xe | uVar64 >> 0x12) ^ ((uVar49 >> 0x18) << 0x19 | uVar64 >> 7)
           ) + uVar41 + uVar22 +
           (uVar44 >> 10 ^ (uVar44 * 0x2000 | uVar44 >> 0x13) ^ (uVar44 * 0x8000 | uVar44 >> 0x11));
  Round(d,uVar51,uVar13,&g,h,uVar16,uVar15,&c,uVar46 + 0xd5a79147);
  uVar52 = c;
  uVar12 = g;
  uVar26 = uVar45 >> 10 ^ (uVar45 * 0x2000 | uVar45 >> 0x13) ^ (uVar45 * 0x8000 | uVar45 >> 0x11);
  iVar59 = (uVar65 >> 3 ^
           (uVar10 << 0xe | uVar65 >> 0x12) ^ ((uVar50 >> 0x18) << 0x19 | uVar65 >> 7)) + uVar64 +
           uVar23;
  uVar25 = iVar59 + uVar26;
  Round(c,uVar14,uVar51,&f,g,uVar11,uVar16,&b,uVar26 + iVar59 + 0x6ca6351);
  uVar15 = b;
  uVar13 = f;
  uVar27 = uVar46 >> 10 ^ (uVar46 * 0x2000 | uVar46 >> 0x13) ^ (uVar46 * 0x8000 | uVar46 >> 0x11);
  iVar59 = (uVar58 >> 3 ^ (uVar58 * 0x4000 | uVar58 >> 0x12) ^ (uVar58 * 0x2000000 | uVar58 >> 7)) +
           uVar65 + uVar24;
  uVar26 = iVar59 + uVar27;
  Round(b,uVar52,uVar14,&e,f,uVar12,uVar11,&a,uVar27 + iVar59 + 0x14292967);
  uVar16 = a;
  uVar51 = e;
  uVar27 = (uVar28 >> 3 ^ (uVar28 * 0x4000 | uVar28 >> 0x12) ^ (uVar28 * 0x2000000 | uVar28 >> 7)) +
           uVar58 + uVar42 +
           (uVar25 >> 10 ^ (uVar25 * 0x2000 | uVar25 >> 0x13) ^ (uVar25 * 0x8000 | uVar25 >> 0x11));
  Round(a,uVar15,uVar52,&d,e,uVar13,uVar12,&h,uVar27 + 0x27b70a85);
  uVar14 = d;
  uVar11 = h;
  uVar47 = (uVar60 >> 3 ^ (uVar60 * 0x4000 | uVar60 >> 0x12) ^ (uVar60 * 0x2000000 | uVar60 >> 7)) +
           uVar28 + uVar43 +
           (uVar26 >> 10 ^ (uVar26 * 0x2000 | uVar26 >> 0x13) ^ (uVar26 * 0x8000 | uVar26 >> 0x11));
  Round(h,uVar16,uVar15,&c,d,uVar51,uVar13,&g,uVar47 + 0x2e1b2138);
  uVar52 = c;
  uVar12 = g;
  uVar48 = (uVar61 >> 3 ^ (uVar61 * 0x4000 | uVar61 >> 0x12) ^ (uVar61 * 0x2000000 | uVar61 >> 7)) +
           uVar60 + uVar44 +
           (uVar27 >> 10 ^ (uVar27 * 0x2000 | uVar27 >> 0x13) ^ (uVar27 * 0x8000 | uVar27 >> 0x11));
  Round(g,uVar11,uVar16,&b,c,uVar14,uVar51,&f,uVar48 + 0x4d2c6dfc);
  uVar15 = b;
  uVar13 = f;
  uVar49 = (uVar62 >> 3 ^ (uVar62 * 0x4000 | uVar62 >> 0x12) ^ (uVar62 * 0x2000000 | uVar62 >> 7)) +
           uVar61 + uVar45 +
           (uVar47 >> 10 ^ (uVar47 * 0x2000 | uVar47 >> 0x13) ^ (uVar47 * 0x8000 | uVar47 >> 0x11));
  Round(f,uVar12,uVar11,&a,b,uVar52,uVar14,&e,uVar49 + 0x53380d13);
  uVar16 = a;
  uVar51 = e;
  uVar50 = (uVar63 >> 3 ^ (uVar63 * 0x4000 | uVar63 >> 0x12) ^ (uVar63 * 0x2000000 | uVar63 >> 7)) +
           uVar62 + uVar46 +
           (uVar48 >> 10 ^ (uVar48 * 0x2000 | uVar48 >> 0x13) ^ (uVar48 * 0x8000 | uVar48 >> 0x11));
  Round(e,uVar13,uVar12,&h,a,uVar15,uVar52,&d,uVar50 + 0x650a7354);
  uVar14 = d;
  uVar11 = h;
  uVar58 = (uVar22 >> 3 ^ (uVar22 * 0x4000 | uVar22 >> 0x12) ^ (uVar22 * 0x2000000 | uVar22 >> 7)) +
           uVar63 + uVar25 +
           (uVar49 >> 10 ^ (uVar49 * 0x2000 | uVar49 >> 0x13) ^ (uVar49 * 0x8000 | uVar49 >> 0x11));
  Round(d,uVar51,uVar13,&g,h,uVar16,uVar15,&c,uVar58 + 0x766a0abb);
  uVar52 = c;
  uVar12 = g;
  uVar22 = (uVar23 >> 3 ^ (uVar23 * 0x4000 | uVar23 >> 0x12) ^ (uVar23 * 0x2000000 | uVar23 >> 7)) +
           uVar22 + uVar26 +
           (uVar50 >> 10 ^ (uVar50 * 0x2000 | uVar50 >> 0x13) ^ (uVar50 * 0x8000 | uVar50 >> 0x11));
  Round(c,uVar14,uVar51,&f,g,uVar11,uVar16,&b,uVar22 + 0x81c2c92e);
  uVar15 = b;
  uVar13 = f;
  uVar23 = (uVar24 >> 3 ^ (uVar24 * 0x4000 | uVar24 >> 0x12) ^ (uVar24 * 0x2000000 | uVar24 >> 7)) +
           uVar23 + uVar27 +
           (uVar58 >> 10 ^ (uVar58 * 0x2000 | uVar58 >> 0x13) ^ (uVar58 * 0x8000 | uVar58 >> 0x11));
  Round(b,uVar52,uVar14,&e,f,uVar12,uVar11,&a,uVar23 + 0x92722c85);
  uVar16 = a;
  uVar51 = e;
  uVar24 = (uVar42 >> 3 ^ (uVar42 * 0x4000 | uVar42 >> 0x12) ^ (uVar42 * 0x2000000 | uVar42 >> 7)) +
           uVar24 + uVar47 +
           (uVar22 >> 10 ^ (uVar22 * 0x2000 | uVar22 >> 0x13) ^ (uVar22 * 0x8000 | uVar22 >> 0x11));
  Round(a,uVar15,uVar52,&d,e,uVar13,uVar12,&h,uVar24 + 0xa2bfe8a1);
  uVar14 = d;
  uVar11 = h;
  uVar42 = (uVar43 >> 3 ^ (uVar43 * 0x4000 | uVar43 >> 0x12) ^ (uVar43 * 0x2000000 | uVar43 >> 7)) +
           uVar42 + uVar48 +
           (uVar23 >> 10 ^ (uVar23 * 0x2000 | uVar23 >> 0x13) ^ (uVar23 * 0x8000 | uVar23 >> 0x11));
  Round(h,uVar16,uVar15,&c,d,uVar51,uVar13,&g,uVar42 + 0xa81a664b);
  uVar52 = c;
  uVar12 = g;
  uVar43 = (uVar44 >> 3 ^ (uVar44 * 0x4000 | uVar44 >> 0x12) ^ (uVar44 * 0x2000000 | uVar44 >> 7)) +
           uVar43 + uVar49 +
           (uVar24 >> 10 ^ (uVar24 * 0x2000 | uVar24 >> 0x13) ^ (uVar24 * 0x8000 | uVar24 >> 0x11));
  Round(g,uVar11,uVar16,&b,c,uVar14,uVar51,&f,uVar43 + 0xc24b8b70);
  uVar15 = b;
  uVar13 = f;
  uVar44 = (uVar45 >> 3 ^ (uVar45 * 0x4000 | uVar45 >> 0x12) ^ (uVar45 * 0x2000000 | uVar45 >> 7)) +
           uVar44 + uVar50 +
           (uVar42 >> 10 ^ (uVar42 * 0x2000 | uVar42 >> 0x13) ^ (uVar42 * 0x8000 | uVar42 >> 0x11));
  Round(f,uVar12,uVar11,&a,b,uVar52,uVar14,&e,uVar44 + 0xc76c51a3);
  uVar16 = a;
  uVar51 = e;
  uVar45 = (uVar46 >> 3 ^ (uVar46 * 0x4000 | uVar46 >> 0x12) ^ (uVar46 * 0x2000000 | uVar46 >> 7)) +
           uVar45 + uVar58 +
           (uVar43 >> 10 ^ (uVar43 * 0x2000 | uVar43 >> 0x13) ^ (uVar43 * 0x8000 | uVar43 >> 0x11));
  Round(e,uVar13,uVar12,&h,a,uVar15,uVar52,&d,uVar45 + 0xd192e819);
  uVar14 = d;
  uVar11 = h;
  uVar46 = (uVar25 >> 3 ^ (uVar25 * 0x4000 | uVar25 >> 0x12) ^ (uVar25 * 0x2000000 | uVar25 >> 7)) +
           uVar46 + uVar22 +
           (uVar44 >> 10 ^ (uVar44 * 0x2000 | uVar44 >> 0x13) ^ (uVar44 * 0x8000 | uVar44 >> 0x11));
  Round(d,uVar51,uVar13,&g,h,uVar16,uVar15,&c,uVar46 + 0xd6990624);
  uVar52 = c;
  uVar12 = g;
  uVar25 = (uVar26 >> 3 ^ (uVar26 * 0x4000 | uVar26 >> 0x12) ^ (uVar26 * 0x2000000 | uVar26 >> 7)) +
           uVar25 + uVar23 +
           (uVar45 >> 10 ^ (uVar45 * 0x2000 | uVar45 >> 0x13) ^ (uVar45 * 0x8000 | uVar45 >> 0x11));
  Round(c,uVar14,uVar51,&f,g,uVar11,uVar16,&b,uVar25 + 0xf40e3585);
  uVar15 = b;
  uVar13 = f;
  uVar26 = (uVar27 >> 3 ^ (uVar27 * 0x4000 | uVar27 >> 0x12) ^ (uVar27 * 0x2000000 | uVar27 >> 7)) +
           uVar26 + uVar24 +
           (uVar46 >> 10 ^ (uVar46 * 0x2000 | uVar46 >> 0x13) ^ (uVar46 * 0x8000 | uVar46 >> 0x11));
  Round(b,uVar52,uVar14,&e,f,uVar12,uVar11,&a,uVar26 + 0x106aa070);
  uVar16 = a;
  uVar51 = e;
  uVar27 = (uVar47 >> 3 ^ (uVar47 * 0x4000 | uVar47 >> 0x12) ^ (uVar47 * 0x2000000 | uVar47 >> 7)) +
           uVar27 + uVar42 +
           (uVar25 >> 10 ^ (uVar25 * 0x2000 | uVar25 >> 0x13) ^ (uVar25 * 0x8000 | uVar25 >> 0x11));
  Round(a,uVar15,uVar52,&d,e,uVar13,uVar12,&h,uVar27 + 0x19a4c116);
  uVar14 = d;
  uVar11 = h;
  uVar47 = (uVar48 >> 3 ^ (uVar48 * 0x4000 | uVar48 >> 0x12) ^ (uVar48 * 0x2000000 | uVar48 >> 7)) +
           uVar47 + uVar43 +
           (uVar26 >> 10 ^ (uVar26 * 0x2000 | uVar26 >> 0x13) ^ (uVar26 * 0x8000 | uVar26 >> 0x11));
  Round(h,uVar16,uVar15,&c,d,uVar51,uVar13,&g,uVar47 + 0x1e376c08);
  uVar52 = c;
  uVar12 = g;
  uVar48 = (uVar49 >> 3 ^ (uVar49 * 0x4000 | uVar49 >> 0x12) ^ (uVar49 * 0x2000000 | uVar49 >> 7)) +
           uVar48 + uVar44 +
           (uVar27 >> 10 ^ (uVar27 * 0x2000 | uVar27 >> 0x13) ^ (uVar27 * 0x8000 | uVar27 >> 0x11));
  Round(g,uVar11,uVar16,&b,c,uVar14,uVar51,&f,uVar48 + 0x2748774c);
  uVar15 = b;
  uVar13 = f;
  uVar49 = (uVar50 >> 3 ^ (uVar50 * 0x4000 | uVar50 >> 0x12) ^ (uVar50 * 0x2000000 | uVar50 >> 7)) +
           uVar49 + uVar45 +
           (uVar47 >> 10 ^ (uVar47 * 0x2000 | uVar47 >> 0x13) ^ (uVar47 * 0x8000 | uVar47 >> 0x11));
  Round(f,uVar12,uVar11,&a,b,uVar52,uVar14,&e,uVar49 + 0x34b0bcb5);
  uVar16 = a;
  uVar51 = e;
  uVar50 = (uVar58 >> 3 ^ (uVar58 * 0x4000 | uVar58 >> 0x12) ^ (uVar58 * 0x2000000 | uVar58 >> 7)) +
           uVar50 + uVar46 +
           (uVar48 >> 10 ^ (uVar48 * 0x2000 | uVar48 >> 0x13) ^ (uVar48 * 0x8000 | uVar48 >> 0x11));
  Round(e,uVar13,uVar12,&h,a,uVar15,uVar52,&d,uVar50 + 0x391c0cb3);
  uVar14 = d;
  uVar11 = h;
  uVar58 = (uVar22 >> 3 ^ (uVar22 * 0x4000 | uVar22 >> 0x12) ^ (uVar22 * 0x2000000 | uVar22 >> 7)) +
           uVar58 + uVar25 +
           (uVar49 >> 10 ^ (uVar49 * 0x2000 | uVar49 >> 0x13) ^ (uVar49 * 0x8000 | uVar49 >> 0x11));
  Round(d,uVar51,uVar13,&g,h,uVar16,uVar15,&c,uVar58 + 0x4ed8aa4a);
  uVar52 = c;
  uVar12 = g;
  uVar22 = (uVar23 >> 3 ^ (uVar23 * 0x4000 | uVar23 >> 0x12) ^ (uVar23 * 0x2000000 | uVar23 >> 7)) +
           uVar22 + uVar26 +
           (uVar50 >> 10 ^ (uVar50 * 0x2000 | uVar50 >> 0x13) ^ (uVar50 * 0x8000 | uVar50 >> 0x11));
  Round(c,uVar14,uVar51,&f,g,uVar11,uVar16,&b,uVar22 + 0x5b9cca4f);
  uVar15 = b;
  uVar13 = f;
  uVar23 = (uVar24 >> 3 ^ (uVar24 * 0x4000 | uVar24 >> 0x12) ^ (uVar24 * 0x2000000 | uVar24 >> 7)) +
           uVar23 + uVar27 +
           (uVar58 >> 10 ^ (uVar58 * 0x2000 | uVar58 >> 0x13) ^ (uVar58 * 0x8000 | uVar58 >> 0x11));
  Round(b,uVar52,uVar14,&e,f,uVar12,uVar11,&a,uVar23 + 0x682e6ff3);
  uVar16 = a;
  uVar51 = e;
  uVar47 = (uVar42 >> 3 ^ (uVar42 * 0x4000 | uVar42 >> 0x12) ^ (uVar42 * 0x2000000 | uVar42 >> 7)) +
           uVar24 + uVar47 +
           (uVar22 >> 10 ^ (uVar22 * 0x2000 | uVar22 >> 0x13) ^ (uVar22 * 0x8000 | uVar22 >> 0x11));
  Round(a,uVar15,uVar52,&d,e,uVar13,uVar12,&h,uVar47 + 0x748f82ee);
  uVar14 = d;
  uVar11 = h;
  uVar42 = (uVar43 >> 3 ^ (uVar43 * 0x4000 | uVar43 >> 0x12) ^ (uVar43 * 0x2000000 | uVar43 >> 7)) +
           uVar42 + uVar48 +
           (uVar23 >> 10 ^ (uVar23 * 0x2000 | uVar23 >> 0x13) ^ (uVar23 * 0x8000 | uVar23 >> 0x11));
  Round(h,uVar16,uVar15,&c,d,uVar51,uVar13,&g,uVar42 + 0x78a5636f);
  uVar52 = c;
  uVar12 = g;
  uVar24 = (uVar44 >> 3 ^ (uVar44 * 0x4000 | uVar44 >> 0x12) ^ (uVar44 * 0x2000000 | uVar44 >> 7)) +
           uVar43 + uVar49 +
           (uVar47 >> 10 ^ (uVar47 * 0x2000 | uVar47 >> 0x13) ^ (uVar47 * 0x8000 | uVar47 >> 0x11));
  Round(g,uVar11,uVar16,&b,c,uVar14,uVar51,&f,uVar24 + 0x84c87814);
  uVar15 = b;
  uVar13 = f;
  uVar42 = (uVar45 >> 3 ^ (uVar45 * 0x4000 | uVar45 >> 0x12) ^ (uVar45 * 0x2000000 | uVar45 >> 7)) +
           uVar44 + uVar50 +
           (uVar42 >> 10 ^ (uVar42 * 0x2000 | uVar42 >> 0x13) ^ (uVar42 * 0x8000 | uVar42 >> 0x11));
  Round(f,uVar12,uVar11,&a,b,uVar52,uVar14,&e,uVar42 + 0x8cc70208);
  uVar14 = a;
  uVar51 = e;
  uVar24 = (uVar46 >> 3 ^ (uVar46 * 0x4000 | uVar46 >> 0x12) ^ (uVar46 * 0x2000000 | uVar46 >> 7)) +
           uVar45 + uVar58 +
           (uVar24 >> 10 ^ (uVar24 * 0x2000 | uVar24 >> 0x13) ^ (uVar24 * 0x8000 | uVar24 >> 0x11));
  Round(e,uVar13,uVar12,&h,a,uVar15,uVar52,&d,uVar24 + 0x90befffa);
  uVar16 = d;
  uVar11 = h;
  uVar22 = (uVar25 >> 3 ^ (uVar25 * 0x4000 | uVar25 >> 0x12) ^ (uVar25 * 0x2000000 | uVar25 >> 7)) +
           uVar46 + uVar22 +
           (uVar42 >> 10 ^ (uVar42 * 0x2000 | uVar42 >> 0x13) ^ (uVar42 * 0x8000 | uVar42 >> 0x11));
  Round(d,uVar51,uVar13,&g,h,uVar14,uVar15,&c,uVar22 + 0xa4506ceb);
  b_00 = c;
  uVar13 = g;
  Round(c,uVar16,uVar51,&f,g,uVar11,uVar14,&b,
        (uVar26 >> 3 ^ (uVar26 * 0x4000 | uVar26 >> 0x12) ^ (uVar26 * 0x2000000 | uVar26 >> 7)) +
        uVar25 + uVar23 + -0x41065c09 +
        (uVar24 >> 10 ^ (uVar24 * 0x2000 | uVar24 >> 0x13) ^ (uVar24 * 0x8000 | uVar24 >> 0x11)));
  uVar19 = b;
  uVar14 = f;
  Round(b,b_00,uVar16,&e,f,uVar13,uVar11,&a,
        (uVar27 >> 3 ^ (uVar27 * 0x4000 | uVar27 >> 0x12) ^ (uVar27 * 0x2000000 | uVar27 >> 7)) +
        uVar26 + uVar47 + -0x398e870e +
        (uVar22 >> 10 ^ (uVar22 * 0x2000 | uVar22 >> 0x13) ^ (uVar22 * 0x8000 | uVar22 >> 0x11)));
  a_00 = a + 0x6a09e667;
  uVar51 = uVar19 + 0xbb67ae85;
  c = b_00 + 0x3c6ef372;
  d = uVar16 + 0xa54ff53a;
  e_00 = e + 0x510e527f;
  uVar52 = uVar14 + 0x9b05688c;
  h = uVar11 + 0x5be0cd19;
  g = uVar13 + 0x1f83d9ab;
  f = uVar52;
  e = e_00;
  b = uVar51;
  a = a_00;
  Round(a_00,uVar51,c,&d,e_00,uVar52,g,&h,0xc28a2f98);
  uVar15 = d;
  uVar12 = h;
  Round(h,a_00,uVar51,&c,d,e_00,uVar52,&g,0x71374491);
  uVar17 = c;
  uVar51 = g;
  Round(g,uVar12,a_00,&b,c,uVar15,e_00,&f,0xb5c0fbcf);
  uVar18 = b;
  uVar52 = f;
  Round(f,uVar51,uVar12,&a,b,uVar17,uVar15,&e,0xe9b5dba5);
  uVar20 = a;
  uVar15 = e;
  Round(e,uVar52,uVar51,&h,a,uVar18,uVar17,&d,0x3956c25b);
  uVar17 = d;
  uVar12 = h;
  Round(d,uVar15,uVar52,&g,h,uVar20,uVar18,&c,0x59f111f1);
  uVar18 = c;
  uVar51 = g;
  Round(c,uVar17,uVar15,&f,g,uVar12,uVar20,&b,0x923f82a4);
  uVar20 = b;
  uVar52 = f;
  Round(b,uVar18,uVar17,&e,f,uVar51,uVar12,&a,0xab1c5ed5);
  uVar21 = a;
  uVar15 = e;
  Round(a,uVar20,uVar18,&d,e,uVar52,uVar51,&h,0xd807aa98);
  uVar17 = d;
  uVar12 = h;
  Round(h,uVar21,uVar20,&c,d,uVar15,uVar52,&g,0x12835b01);
  uVar18 = c;
  uVar51 = g;
  Round(g,uVar12,uVar21,&b,c,uVar17,uVar15,&f,0x243185be);
  uVar20 = b;
  uVar52 = f;
  Round(f,uVar51,uVar12,&a,b,uVar18,uVar17,&e,0x550c7dc3);
  uVar21 = a;
  uVar15 = e;
  Round(e,uVar52,uVar51,&h,a,uVar20,uVar18,&d,0x72be5d74);
  uVar17 = d;
  uVar12 = h;
  Round(d,uVar15,uVar52,&g,h,uVar21,uVar20,&c,0x80deb1fe);
  uVar18 = c;
  uVar51 = g;
  Round(c,uVar17,uVar15,&f,g,uVar12,uVar21,&b,0x9bdc06a7);
  uVar20 = b;
  uVar52 = f;
  Round(b,uVar18,uVar17,&e,f,uVar51,uVar12,&a,0xc19bf374);
  uVar21 = a;
  uVar15 = e;
  Round(a,uVar20,uVar18,&d,e,uVar52,uVar51,&h,0x649b69c1);
  uVar17 = d;
  uVar12 = h;
  Round(h,uVar21,uVar20,&c,d,uVar15,uVar52,&g,0xf0fe4786);
  uVar18 = c;
  uVar51 = g;
  Round(g,uVar12,uVar21,&b,c,uVar17,uVar15,&f,0xfe1edc6);
  uVar20 = b;
  uVar52 = f;
  Round(f,uVar51,uVar12,&a,b,uVar18,uVar17,&e,0x240cf254);
  uVar21 = a;
  uVar15 = e;
  Round(e,uVar52,uVar51,&h,a,uVar20,uVar18,&d,0x4fe9346f);
  uVar17 = d;
  uVar12 = h;
  Round(d,uVar15,uVar52,&g,h,uVar21,uVar20,&c,0x6cc984be);
  uVar18 = c;
  uVar51 = g;
  Round(c,uVar17,uVar15,&f,g,uVar12,uVar21,&b,0x61b9411e);
  uVar20 = b;
  uVar52 = f;
  Round(b,uVar18,uVar17,&e,f,uVar51,uVar12,&a,0x16f988fa);
  uVar21 = a;
  uVar15 = e;
  Round(a,uVar20,uVar18,&d,e,uVar52,uVar51,&h,0xf2c65152);
  uVar17 = d;
  uVar12 = h;
  Round(h,uVar21,uVar20,&c,d,uVar15,uVar52,&g,0xa88e5a6d);
  uVar18 = c;
  uVar51 = g;
  Round(g,uVar12,uVar21,&b,c,uVar17,uVar15,&f,0xb019fc65);
  uVar20 = b;
  uVar52 = f;
  Round(f,uVar51,uVar12,&a,b,uVar18,uVar17,&e,0xb9d99ec7);
  uVar21 = a;
  uVar15 = e;
  Round(e,uVar52,uVar51,&h,a,uVar20,uVar18,&d,0x9a1231c3);
  uVar17 = d;
  uVar12 = h;
  Round(d,uVar15,uVar52,&g,h,uVar21,uVar20,&c,0xe70eeaa0);
  uVar18 = c;
  uVar51 = g;
  Round(c,uVar17,uVar15,&f,g,uVar12,uVar21,&b,0xfdb1232b);
  uVar20 = b;
  uVar52 = f;
  Round(b,uVar18,uVar17,&e,f,uVar51,uVar12,&a,0xc7353eb0);
  uVar21 = a;
  uVar15 = e;
  Round(a,uVar20,uVar18,&d,e,uVar52,uVar51,&h,0x3069bad5);
  uVar17 = d;
  uVar12 = h;
  Round(h,uVar21,uVar20,&c,d,uVar15,uVar52,&g,0xcb976d5f);
  uVar18 = c;
  uVar51 = g;
  Round(g,uVar12,uVar21,&b,c,uVar17,uVar15,&f,0x5a0f118f);
  uVar20 = b;
  uVar52 = f;
  Round(f,uVar51,uVar12,&a,b,uVar18,uVar17,&e,0xdc1eeefd);
  uVar21 = a;
  uVar15 = e;
  Round(e,uVar52,uVar51,&h,a,uVar20,uVar18,&d,0xa35b689);
  uVar17 = d;
  uVar12 = h;
  Round(d,uVar15,uVar52,&g,h,uVar21,uVar20,&c,0xde0b7a04);
  uVar18 = c;
  uVar51 = g;
  Round(c,uVar17,uVar15,&f,g,uVar12,uVar21,&b,0x58f4ca9d);
  uVar20 = b;
  uVar52 = f;
  Round(b,uVar18,uVar17,&e,f,uVar51,uVar12,&a,0xe15d5b16);
  uVar21 = a;
  uVar15 = e;
  Round(a,uVar20,uVar18,&d,e,uVar52,uVar51,&h,0x7f3e86);
  uVar17 = d;
  uVar12 = h;
  Round(h,uVar21,uVar20,&c,d,uVar15,uVar52,&g,0x37088980);
  uVar18 = c;
  uVar51 = g;
  Round(g,uVar12,uVar21,&b,c,uVar17,uVar15,&f,0xa507ea32);
  uVar20 = b;
  uVar52 = f;
  Round(f,uVar51,uVar12,&a,b,uVar18,uVar17,&e,0x6fab9537);
  uVar21 = a;
  uVar15 = e;
  Round(e,uVar52,uVar51,&h,a,uVar20,uVar18,&d,0x17406110);
  uVar17 = d;
  uVar12 = h;
  Round(d,uVar15,uVar52,&g,h,uVar21,uVar20,&c,0xd8cd6f1);
  uVar18 = c;
  uVar51 = g;
  Round(c,uVar17,uVar15,&f,g,uVar12,uVar21,&b,0xcdaa3b6d);
  uVar20 = b;
  uVar52 = f;
  Round(b,uVar18,uVar17,&e,f,uVar51,uVar12,&a,0xc0bbbe37);
  uVar21 = a;
  uVar15 = e;
  Round(a,uVar20,uVar18,&d,e,uVar52,uVar51,&h,0x83613bda);
  uVar17 = d;
  uVar12 = h;
  Round(h,uVar21,uVar20,&c,d,uVar15,uVar52,&g,0xdb48a363);
  uVar18 = c;
  uVar51 = g;
  Round(g,uVar12,uVar21,&b,c,uVar17,uVar15,&f,0xb02e931);
  uVar20 = b;
  uVar52 = f;
  Round(f,uVar51,uVar12,&a,b,uVar18,uVar17,&e,0x6fd15ca7);
  uVar21 = a;
  uVar15 = e;
  Round(e,uVar52,uVar51,&h,a,uVar20,uVar18,&d,0x521afaca);
  uVar17 = d;
  uVar12 = h;
  Round(d,uVar15,uVar52,&g,h,uVar21,uVar20,&c,0x31338431);
  uVar18 = c;
  uVar51 = g;
  Round(c,uVar17,uVar15,&f,g,uVar12,uVar21,&b,0x6ed41a95);
  uVar20 = b;
  uVar52 = f;
  Round(b,uVar18,uVar17,&e,f,uVar51,uVar12,&a,0x6d437890);
  uVar21 = a;
  uVar15 = e;
  Round(a,uVar20,uVar18,&d,e,uVar52,uVar51,&h,0xc39c91f2);
  uVar17 = d;
  uVar12 = h;
  Round(h,uVar21,uVar20,&c,d,uVar15,uVar52,&g,0x9eccabbd);
  uVar18 = c;
  uVar51 = g;
  Round(g,uVar12,uVar21,&b,c,uVar17,uVar15,&f,0xb5c9a0e6);
  uVar20 = b;
  uVar52 = f;
  Round(f,uVar51,uVar12,&a,b,uVar18,uVar17,&e,0x532fb63c);
  uVar21 = a;
  uVar15 = e;
  Round(e,uVar52,uVar51,&h,a,uVar20,uVar18,&d,0xd2c741c6);
  uVar17 = d;
  uVar12 = h;
  Round(d,uVar15,uVar52,&g,h,uVar21,uVar20,&c,0x7237ea3);
  uVar18 = c;
  uVar51 = g;
  Round(c,uVar17,uVar15,&f,g,uVar12,uVar21,&b,0xa4954b68);
  uVar15 = b;
  uVar52 = f;
  Round(b,uVar18,uVar17,&e,f,uVar51,uVar12,&a,0x4c191d76);
  iVar66 = uVar15 + uVar19;
  uVar45 = iVar66 + 0xbb67ae85;
  uVar22 = uVar18 + 0x3c6ef372 + b_00;
  uVar23 = uVar17 + 0xa54ff53a + uVar16;
  uVar24 = uVar52 + 0x9b05688c + uVar14;
  uVar25 = uVar51 + 0x1f83d9ab + uVar13;
  iVar59 = a_00 + a;
  uVar26 = uVar11 + uVar12 + 0x5be0cd19;
  uVar27 = e_00 + e;
  a = 0x6a09e667;
  b = 0xbb67ae85;
  c = 0x3c6ef372;
  d = 0xa54ff53a;
  e = 0x510e527f;
  f = 0x9b05688c;
  g = 0x1f83d9ab;
  h = 0x5be0cd19;
  Round(0x6a09e667,0xbb67ae85,0x3c6ef372,&d,0x510e527f,0x9b05688c,0x1f83d9ab,&h,iVar59 + 0x428a2f98)
  ;
  uVar52 = d;
  uVar13 = h;
  Round(h,0x6a09e667,0xbb67ae85,&c,d,0x510e527f,0x9b05688c,&g,iVar66 + 0x2c9ef316);
  uVar15 = c;
  uVar51 = g;
  Round(g,uVar13,0x6a09e667,&b,c,uVar52,0x510e527f,&f,uVar22 + 0xb5c0fbcf);
  uVar16 = b;
  uVar14 = f;
  Round(f,uVar51,uVar13,&a,b,uVar15,uVar52,&e,uVar23 + 0xe9b5dba5);
  uVar17 = a;
  uVar52 = e;
  Round(e,uVar14,uVar51,&h,a,uVar16,uVar15,&d,uVar27 + 0x3956c25b);
  uVar15 = d;
  uVar13 = h;
  Round(d,uVar52,uVar14,&g,h,uVar17,uVar16,&c,uVar24 + 0x59f111f1);
  uVar16 = c;
  uVar51 = g;
  Round(c,uVar15,uVar52,&f,g,uVar13,uVar17,&b,uVar25 + 0x923f82a4);
  uVar52 = b;
  uVar14 = f;
  Round(b,uVar16,uVar15,&e,f,uVar51,uVar13,&a,uVar11 + uVar12 + 0x6fd2bee);
  uVar15 = a;
  uVar13 = e;
  Round(a,uVar52,uVar16,&d,e,uVar14,uVar51,&h,0x5807aa98);
  uVar51 = d;
  uVar11 = h;
  Round(h,uVar15,uVar52,&c,d,uVar13,uVar14,&g,0x12835b01);
  uVar14 = c;
  uVar12 = g;
  Round(g,uVar11,uVar15,&b,c,uVar51,uVar13,&f,0x243185be);
  uVar52 = b;
  uVar13 = f;
  Round(f,uVar12,uVar11,&a,b,uVar14,uVar51,&e,0x550c7dc3);
  uVar15 = a;
  uVar51 = e;
  Round(e,uVar13,uVar12,&h,a,uVar52,uVar14,&d,0x72be5d74);
  uVar14 = d;
  uVar11 = h;
  Round(d,uVar51,uVar13,&g,h,uVar15,uVar52,&c,0x80deb1fe);
  uVar52 = c;
  uVar12 = g;
  Round(c,uVar14,uVar51,&f,g,uVar11,uVar15,&b,0x9bdc06a7);
  uVar15 = b;
  uVar13 = f;
  Round(b,uVar52,uVar14,&e,f,uVar12,uVar11,&a,0xc19bf274);
  uVar16 = a;
  uVar51 = e;
  uVar44 = (uVar45 >> 3 ^ (uVar45 * 0x4000 | uVar45 >> 0x12) ^ (uVar45 * 0x2000000 | uVar45 >> 7)) +
           iVar59;
  Round(a,uVar15,uVar52,&d,e,uVar13,uVar12,&h,uVar44 + 0xe49b69c1);
  uVar14 = d;
  uVar11 = h;
  uVar42 = uVar22 >> 3 ^ (uVar22 * 0x4000 | uVar22 >> 0x12) ^ (uVar22 * 0x2000000 | uVar22 >> 7);
  iVar53 = uVar42 + uVar45;
  iVar54 = uVar42 + uVar45;
  uVar43 = iVar54 + 0xa00000;
  Round(h,uVar16,uVar15,&c,d,uVar51,uVar13,&g,uVar42 + uVar45 + 0xf05e4786);
  uVar52 = c;
  uVar12 = g;
  uVar42 = (uVar23 >> 3 ^ (uVar23 * 0x4000 | uVar23 >> 0x12) ^ (uVar23 * 0x2000000 | uVar23 >> 7)) +
           uVar22 + (uVar44 >> 10 ^
                    (uVar44 * 0x2000 | uVar44 >> 0x13) ^ (uVar44 * 0x8000 | uVar44 >> 0x11));
  Round(g,uVar11,uVar16,&b,c,uVar14,uVar51,&f,uVar42 + 0xfc19dc6);
  uVar15 = b;
  uVar13 = f;
  uVar45 = (uVar27 >> 3 ^ (uVar27 * 0x4000 | uVar27 >> 0x12) ^ (uVar27 * 0x2000000 | uVar27 >> 7)) +
           uVar23 + (uVar43 >> 10 ^
                    (iVar54 * 0x2000 | uVar43 >> 0x13) ^ (iVar54 * 0x8000 | uVar43 >> 0x11));
  Round(f,uVar12,uVar11,&a,b,uVar52,uVar14,&e,uVar45 + 0x240ca1cc);
  uVar16 = a;
  uVar51 = e;
  uVar46 = (uVar24 >> 3 ^ (uVar24 * 0x4000 | uVar24 >> 0x12) ^ (uVar24 * 0x2000000 | uVar24 >> 7)) +
           uVar27 + (uVar42 >> 10 ^
                    (uVar42 * 0x2000 | uVar42 >> 0x13) ^ (uVar42 * 0x8000 | uVar42 >> 0x11));
  Round(e,uVar13,uVar12,&h,a,uVar15,uVar52,&d,uVar46 + 0x2de92c6f);
  uVar14 = d;
  uVar11 = h;
  uVar47 = (uVar25 >> 3 ^ (uVar25 * 0x4000 | uVar25 >> 0x12) ^ (uVar25 * 0x2000000 | uVar25 >> 7)) +
           uVar24 + (uVar45 >> 10 ^
                    (uVar45 * 0x2000 | uVar45 >> 0x13) ^ (uVar45 * 0x8000 | uVar45 >> 0x11));
  Round(d,uVar51,uVar13,&g,h,uVar16,uVar15,&c,uVar47 + 0x4a7484aa);
  uVar52 = c;
  uVar12 = g;
  uVar22 = uVar46 >> 10 ^ (uVar46 * 0x2000 | uVar46 >> 0x13) ^ (uVar46 * 0x8000 | uVar46 >> 0x11);
  iVar66 = (uVar26 >> 3 ^ (uVar26 * 0x4000 | uVar26 >> 0x12) ^ (uVar26 * 0x2000000 | uVar26 >> 7)) +
           uVar25;
  iVar59 = iVar66 + uVar22;
  uVar48 = iVar59 + 0x100;
  Round(c,uVar14,uVar51,&f,g,uVar11,uVar16,&b,uVar22 + iVar66 + 0x5cb0aadc);
  uVar15 = b;
  uVar13 = f;
  uVar22 = uVar47 >> 10 ^ (uVar47 * 0x2000 | uVar47 >> 0x13) ^ (uVar47 * 0x8000 | uVar47 >> 0x11);
  iVar67 = uVar26 + uVar44;
  iVar66 = uVar22 + iVar67;
  uVar25 = uVar22 + iVar67 + 0x11002000;
  Round(b,uVar52,uVar14,&e,f,uVar12,uVar11,&a,uVar22 + iVar67 + 0x87f9a8da);
  uVar16 = a;
  uVar51 = e;
  uVar23 = uVar48 >> 10 ^ (uVar48 * 0x2000 | uVar48 >> 0x13) ^ (uVar48 * 0x8000 | uVar48 >> 0x11);
  iVar55 = uVar23 + iVar53 + 0xa00000;
  iVar56 = uVar23 + iVar53;
  uVar26 = iVar56 + 0x80a00000;
  Round(a,uVar15,uVar52,&d,e,uVar13,uVar12,&h,uVar23 + iVar53 + 0x18de5152);
  uVar14 = d;
  uVar11 = h;
  uVar49 = (uVar25 >> 10 ^ (uVar25 * 0x2000 | uVar25 >> 0x13) ^ (uVar25 * 0x8000 | uVar25 >> 0x11))
           + uVar42;
  Round(h,uVar16,uVar15,&c,d,uVar51,uVar13,&g,uVar49 + 0xa831c66d);
  uVar52 = c;
  uVar12 = g;
  uVar50 = (uVar26 >> 10 ^ (iVar56 * 0x2000 | uVar26 >> 0x13) ^ (iVar56 * 0x8000 | uVar26 >> 0x11))
           + uVar45;
  Round(g,uVar11,uVar16,&b,c,uVar14,uVar51,&f,uVar50 + 0xb00327c8);
  uVar15 = b;
  uVar13 = f;
  uVar58 = (uVar49 >> 10 ^ (uVar49 * 0x2000 | uVar49 >> 0x13) ^ (uVar49 * 0x8000 | uVar49 >> 0x11))
           + uVar46;
  Round(f,uVar12,uVar11,&a,b,uVar52,uVar14,&e,uVar58 + 0xbf597fc7);
  uVar16 = a;
  uVar51 = e;
  uVar60 = (uVar50 >> 10 ^ (uVar50 * 0x2000 | uVar50 >> 0x13) ^ (uVar50 * 0x8000 | uVar50 >> 0x11))
           + uVar47;
  Round(e,uVar13,uVar12,&h,a,uVar15,uVar52,&d,uVar60 + 0xc6e00bf3);
  uVar14 = d;
  uVar11 = h;
  iVar68 = (uVar58 >> 10 ^ (uVar58 * 0x2000 | uVar58 >> 0x13) ^ (uVar58 * 0x8000 | uVar58 >> 0x11))
           + iVar59;
  uVar63 = iVar68 + 0x100;
  Round(d,uVar51,uVar13,&g,h,uVar16,uVar15,&c,iVar68 + 0xd5a79247);
  uVar52 = c;
  uVar12 = g;
  uVar23 = uVar60 >> 10 ^ (uVar60 * 0x2000 | uVar60 >> 0x13) ^ (uVar60 * 0x8000 | uVar60 >> 0x11);
  uVar27 = uVar23 + iVar66 + 0x11402022;
  Round(c,uVar14,uVar51,&f,g,uVar11,uVar16,&b,uVar23 + iVar66 + 0x180a8373);
  uVar15 = b;
  uVar13 = f;
  uVar24 = uVar63 >> 10 ^ (uVar63 * 0x2000 | uVar63 >> 0x13) ^ (uVar63 * 0x8000 | uVar63 >> 0x11);
  iVar57 = iVar55 + (uVar44 >> 3 ^
                    (uVar44 * 0x4000 | uVar44 >> 0x12) ^ (uVar44 * 0x2000000 | uVar44 >> 7)) +
           -0x80000000;
  iVar1 = iVar57 + uVar24;
  uVar69 = iVar1 + 0x100;
  Round(b,uVar52,uVar14,&e,f,uVar12,uVar11,&a,uVar24 + iVar57 + 0x14292a67);
  uVar16 = a;
  uVar51 = e;
  uVar61 = (uVar43 >> 3 ^ (iVar54 * 0x4000 | uVar43 >> 0x12) ^ (iVar54 * 0x2000000 | uVar43 >> 7)) +
           uVar44 + uVar49 +
           (uVar27 >> 10 ^ (uVar27 * 0x2000 | uVar27 >> 0x13) ^ (uVar27 * 0x8000 | uVar27 >> 0x11));
  Round(a,uVar15,uVar52,&d,e,uVar13,uVar12,&h,uVar61 + 0x27b70a85);
  uVar14 = d;
  uVar11 = h;
  uVar24 = iVar53 + (uVar42 >> 3 ^
                    (uVar42 * 0x4000 | uVar42 >> 0x12) ^ (uVar42 * 0x2000000 | uVar42 >> 7)) +
           0xa00000 + uVar50 +
           (uVar69 >> 10 ^ (uVar69 * 0x2000 | uVar69 >> 0x13) ^ (uVar69 * 0x8000 | uVar69 >> 0x11));
  Round(h,uVar16,uVar15,&c,d,uVar51,uVar13,&g,uVar24 + 0x2e1b2138);
  uVar52 = c;
  uVar12 = g;
  uVar42 = (uVar45 >> 3 ^ (uVar45 * 0x4000 | uVar45 >> 0x12) ^ (uVar45 * 0x2000000 | uVar45 >> 7)) +
           uVar42 + uVar58 +
           (uVar61 >> 10 ^ (uVar61 * 0x2000 | uVar61 >> 0x13) ^ (uVar61 * 0x8000 | uVar61 >> 0x11));
  Round(g,uVar11,uVar16,&b,c,uVar14,uVar51,&f,uVar42 + 0x4d2c6dfc);
  uVar15 = b;
  uVar13 = f;
  uVar43 = (uVar46 >> 3 ^ (uVar46 * 0x4000 | uVar46 >> 0x12) ^ (uVar46 * 0x2000000 | uVar46 >> 7)) +
           uVar45 + uVar60 +
           (uVar24 >> 10 ^ (uVar24 * 0x2000 | uVar24 >> 0x13) ^ (uVar24 * 0x8000 | uVar24 >> 0x11));
  Round(f,uVar12,uVar11,&a,b,uVar52,uVar14,&e,uVar43 + 0x53380d13);
  uVar16 = a;
  uVar51 = e;
  uVar44 = (uVar47 >> 3 ^ (uVar47 * 0x4000 | uVar47 >> 0x12) ^ (uVar47 * 0x2000000 | uVar47 >> 7)) +
           uVar46 + uVar63 +
           (uVar42 >> 10 ^ (uVar42 * 0x2000 | uVar42 >> 0x13) ^ (uVar42 * 0x8000 | uVar42 >> 0x11));
  Round(e,uVar13,uVar12,&h,a,uVar15,uVar52,&d,uVar44 + 0x650a7354);
  uVar14 = d;
  uVar11 = h;
  uVar62 = (uVar48 >> 3 ^ (uVar48 * 0x4000 | uVar48 >> 0x12) ^ (iVar59 * 0x2000000 | uVar48 >> 7)) +
           uVar47 + uVar27 +
           (uVar43 >> 10 ^ (uVar43 * 0x2000 | uVar43 >> 0x13) ^ (uVar43 * 0x8000 | uVar43 >> 0x11));
  Round(d,uVar51,uVar13,&g,h,uVar16,uVar15,&c,uVar62 + 0x766a0abb);
  uVar52 = c;
  uVar12 = g;
  uVar22 = iVar59 + (uVar25 >> 3 ^
                    (uVar25 * 0x4000 | uVar25 >> 0x12) ^
                    ((uVar22 + iVar67) * 0x2000000 | uVar25 >> 7)) + 0x100 + uVar69 +
           (uVar44 >> 10 ^ (uVar44 * 0x2000 | uVar44 >> 0x13) ^ (uVar44 * 0x8000 | uVar44 >> 0x11));
  Round(c,uVar14,uVar51,&f,g,uVar11,uVar16,&b,uVar22 + 0x81c2c92e);
  uVar15 = b;
  uVar13 = f;
  uVar25 = iVar66 + (uVar26 >> 3 ^
                    (iVar56 * 0x4000 | uVar26 >> 0x12) ^ (iVar56 * 0x2000000 | uVar26 >> 7)) +
           0x11002000 + uVar61 +
           (uVar62 >> 10 ^ (uVar62 * 0x2000 | uVar62 >> 0x13) ^ (uVar62 * 0x8000 | uVar62 >> 0x11));
  Round(b,uVar52,uVar14,&e,f,uVar12,uVar11,&a,uVar25 + 0x92722c85);
  uVar16 = a;
  uVar51 = e;
  uVar26 = iVar55 + (uVar49 >> 3 ^
                    (uVar49 * 0x4000 | uVar49 >> 0x12) ^ (uVar49 * 0x2000000 | uVar49 >> 7)) +
           -0x80000000 + uVar24 +
           (uVar22 >> 10 ^ (uVar22 * 0x2000 | uVar22 >> 0x13) ^ (uVar22 * 0x8000 | uVar22 >> 0x11));
  Round(a,uVar15,uVar52,&d,e,uVar13,uVar12,&h,uVar26 + 0xa2bfe8a1);
  uVar14 = d;
  uVar11 = h;
  uVar45 = (uVar50 >> 3 ^ (uVar50 * 0x4000 | uVar50 >> 0x12) ^ (uVar50 * 0x2000000 | uVar50 >> 7)) +
           uVar49 + uVar42 +
           (uVar25 >> 10 ^ (uVar25 * 0x2000 | uVar25 >> 0x13) ^ (uVar25 * 0x8000 | uVar25 >> 0x11));
  Round(h,uVar16,uVar15,&c,d,uVar51,uVar13,&g,uVar45 + 0xa81a664b);
  uVar52 = c;
  uVar12 = g;
  uVar46 = (uVar58 >> 3 ^ (uVar58 * 0x4000 | uVar58 >> 0x12) ^ (uVar58 * 0x2000000 | uVar58 >> 7)) +
           uVar50 + uVar43 +
           (uVar26 >> 10 ^ (uVar26 * 0x2000 | uVar26 >> 0x13) ^ (uVar26 * 0x8000 | uVar26 >> 0x11));
  Round(g,uVar11,uVar16,&b,c,uVar14,uVar51,&f,uVar46 + 0xc24b8b70);
  uVar15 = b;
  uVar13 = f;
  uVar47 = (uVar60 >> 3 ^ (uVar60 * 0x4000 | uVar60 >> 0x12) ^ (uVar60 * 0x2000000 | uVar60 >> 7)) +
           uVar58 + uVar44 +
           (uVar45 >> 10 ^ (uVar45 * 0x2000 | uVar45 >> 0x13) ^ (uVar45 * 0x8000 | uVar45 >> 0x11));
  Round(f,uVar12,uVar11,&a,b,uVar52,uVar14,&e,uVar47 + 0xc76c51a3);
  uVar16 = a;
  uVar51 = e;
  uVar48 = (uVar63 >> 3 ^ (uVar63 * 0x4000 | uVar63 >> 0x12) ^ (iVar68 * 0x2000000 | uVar63 >> 7)) +
           uVar60 + uVar62 +
           (uVar46 >> 10 ^ (uVar46 * 0x2000 | uVar46 >> 0x13) ^ (uVar46 * 0x8000 | uVar46 >> 0x11));
  Round(e,uVar13,uVar12,&h,a,uVar15,uVar52,&d,uVar48 + 0xd192e819);
  uVar14 = d;
  uVar11 = h;
  uVar58 = (uVar27 >> 3 ^ (uVar27 * 0x4000 | uVar27 >> 0x12) ^ (uVar27 * 0x2000000 | uVar27 >> 7)) +
           uVar63 + uVar22 +
           (uVar47 >> 10 ^ (uVar47 * 0x2000 | uVar47 >> 0x13) ^ (uVar47 * 0x8000 | uVar47 >> 0x11));
  Round(d,uVar51,uVar13,&g,h,uVar16,uVar15,&c,uVar58 + 0xd6990624);
  uVar52 = c;
  uVar12 = g;
  uVar23 = uVar23 + iVar66 +
           (uVar69 >> 3 ^ (uVar69 * 0x4000 | uVar69 >> 0x12) ^ (iVar1 * 0x2000000 | uVar69 >> 7)) +
           0x11402022 + uVar25 +
           (uVar48 >> 10 ^ (uVar48 * 0x2000 | uVar48 >> 0x13) ^ (uVar48 * 0x8000 | uVar48 >> 0x11));
  Round(c,uVar14,uVar51,&f,g,uVar11,uVar16,&b,uVar23 + 0xf40e3585);
  uVar15 = b;
  uVar13 = f;
  uVar27 = iVar1 + (uVar61 >> 3 ^
                   (uVar61 * 0x4000 | uVar61 >> 0x12) ^ (uVar61 * 0x2000000 | uVar61 >> 7)) + 0x100
           + uVar26 +
           (uVar58 >> 10 ^ (uVar58 * 0x2000 | uVar58 >> 0x13) ^ (uVar58 * 0x8000 | uVar58 >> 0x11));
  Round(b,uVar52,uVar14,&e,f,uVar12,uVar11,&a,uVar27 + 0x106aa070);
  uVar16 = a;
  uVar51 = e;
  uVar49 = (uVar24 >> 3 ^ (uVar24 * 0x4000 | uVar24 >> 0x12) ^ (uVar24 * 0x2000000 | uVar24 >> 7)) +
           uVar61 + uVar45 +
           (uVar23 >> 10 ^ (uVar23 * 0x2000 | uVar23 >> 0x13) ^ (uVar23 * 0x8000 | uVar23 >> 0x11));
  Round(a,uVar15,uVar52,&d,e,uVar13,uVar12,&h,uVar49 + 0x19a4c116);
  uVar14 = d;
  uVar11 = h;
  uVar60 = (uVar42 >> 3 ^ (uVar42 * 0x4000 | uVar42 >> 0x12) ^ (uVar42 * 0x2000000 | uVar42 >> 7)) +
           uVar24 + uVar46 +
           (uVar27 >> 10 ^ (uVar27 * 0x2000 | uVar27 >> 0x13) ^ (uVar27 * 0x8000 | uVar27 >> 0x11));
  Round(h,uVar16,uVar15,&c,d,uVar51,uVar13,&g,uVar60 + 0x1e376c08);
  uVar52 = c;
  uVar12 = g;
  uVar50 = (uVar43 >> 3 ^ (uVar43 * 0x4000 | uVar43 >> 0x12) ^ (uVar43 * 0x2000000 | uVar43 >> 7)) +
           uVar42 + uVar47 +
           (uVar49 >> 10 ^ (uVar49 * 0x2000 | uVar49 >> 0x13) ^ (uVar49 * 0x8000 | uVar49 >> 0x11));
  Round(g,uVar11,uVar16,&b,c,uVar14,uVar51,&f,uVar50 + 0x2748774c);
  uVar15 = b;
  uVar13 = f;
  uVar24 = (uVar44 >> 3 ^ (uVar44 * 0x4000 | uVar44 >> 0x12) ^ (uVar44 * 0x2000000 | uVar44 >> 7)) +
           uVar43 + uVar48 +
           (uVar60 >> 10 ^ (uVar60 * 0x2000 | uVar60 >> 0x13) ^ (uVar60 * 0x8000 | uVar60 >> 0x11));
  Round(f,uVar12,uVar11,&a,b,uVar52,uVar14,&e,uVar24 + 0x34b0bcb5);
  uVar16 = a;
  uVar51 = e;
  uVar43 = (uVar62 >> 3 ^ (uVar62 * 0x4000 | uVar62 >> 0x12) ^ (uVar62 * 0x2000000 | uVar62 >> 7)) +
           uVar44 + uVar58 +
           (uVar50 >> 10 ^ (uVar50 * 0x2000 | uVar50 >> 0x13) ^ (uVar50 * 0x8000 | uVar50 >> 0x11));
  Round(e,uVar13,uVar12,&h,a,uVar15,uVar52,&d,uVar43 + 0x391c0cb3);
  uVar14 = d;
  uVar11 = h;
  uVar42 = (uVar22 >> 3 ^ (uVar22 * 0x4000 | uVar22 >> 0x12) ^ (uVar22 * 0x2000000 | uVar22 >> 7)) +
           uVar62 + uVar23 +
           (uVar24 >> 10 ^ (uVar24 * 0x2000 | uVar24 >> 0x13) ^ (uVar24 * 0x8000 | uVar24 >> 0x11));
  Round(d,uVar51,uVar13,&g,h,uVar16,uVar15,&c,uVar42 + 0x4ed8aa4a);
  uVar52 = c;
  uVar12 = g;
  uVar22 = (uVar25 >> 3 ^ (uVar25 * 0x4000 | uVar25 >> 0x12) ^ (uVar25 * 0x2000000 | uVar25 >> 7)) +
           uVar22 + uVar27 +
           (uVar43 >> 10 ^ (uVar43 * 0x2000 | uVar43 >> 0x13) ^ (uVar43 * 0x8000 | uVar43 >> 0x11));
  Round(c,uVar14,uVar51,&f,g,uVar11,uVar16,&b,uVar22 + 0x5b9cca4f);
  uVar15 = b;
  uVar13 = f;
  uVar25 = (uVar26 >> 3 ^ (uVar26 * 0x4000 | uVar26 >> 0x12) ^ (uVar26 * 0x2000000 | uVar26 >> 7)) +
           uVar25 + uVar49 +
           (uVar42 >> 10 ^ (uVar42 * 0x2000 | uVar42 >> 0x13) ^ (uVar42 * 0x8000 | uVar42 >> 0x11));
  Round(b,uVar52,uVar14,&e,f,uVar12,uVar11,&a,uVar25 + 0x682e6ff3);
  uVar16 = a;
  uVar51 = e;
  uVar26 = (uVar45 >> 3 ^ (uVar45 * 0x4000 | uVar45 >> 0x12) ^ (uVar45 * 0x2000000 | uVar45 >> 7)) +
           uVar26 + uVar60 +
           (uVar22 >> 10 ^ (uVar22 * 0x2000 | uVar22 >> 0x13) ^ (uVar22 * 0x8000 | uVar22 >> 0x11));
  Round(a,uVar15,uVar52,&d,e,uVar13,uVar12,&h,uVar26 + 0x748f82ee);
  uVar14 = d;
  uVar11 = h;
  uVar44 = (uVar46 >> 3 ^ (uVar46 * 0x4000 | uVar46 >> 0x12) ^ (uVar46 * 0x2000000 | uVar46 >> 7)) +
           uVar45 + uVar50 +
           (uVar25 >> 10 ^ (uVar25 * 0x2000 | uVar25 >> 0x13) ^ (uVar25 * 0x8000 | uVar25 >> 0x11));
  Round(h,uVar16,uVar15,&c,d,uVar51,uVar13,&g,uVar44 + 0x78a5636f);
  uVar52 = c;
  uVar12 = g;
  uVar24 = (uVar47 >> 3 ^ (uVar47 * 0x4000 | uVar47 >> 0x12) ^ (uVar47 * 0x2000000 | uVar47 >> 7)) +
           uVar46 + uVar24 +
           (uVar26 >> 10 ^ (uVar26 * 0x2000 | uVar26 >> 0x13) ^ (uVar26 * 0x8000 | uVar26 >> 0x11));
  Round(g,uVar11,uVar16,&b,c,uVar14,uVar51,&f,uVar24 + 0x84c87814);
  uVar15 = b;
  uVar13 = f;
  uVar43 = (uVar48 >> 3 ^ (uVar48 * 0x4000 | uVar48 >> 0x12) ^ (uVar48 * 0x2000000 | uVar48 >> 7)) +
           uVar47 + uVar43 +
           (uVar44 >> 10 ^ (uVar44 * 0x2000 | uVar44 >> 0x13) ^ (uVar44 * 0x8000 | uVar44 >> 0x11));
  Round(f,uVar12,uVar11,&a,b,uVar52,uVar14,&e,uVar43 + 0x8cc70208);
  uVar16 = a;
  uVar51 = e;
  uVar24 = (uVar58 >> 3 ^ (uVar58 * 0x4000 | uVar58 >> 0x12) ^ (uVar58 * 0x2000000 | uVar58 >> 7)) +
           uVar48 + uVar42 +
           (uVar24 >> 10 ^ (uVar24 * 0x2000 | uVar24 >> 0x13) ^ (uVar24 * 0x8000 | uVar24 >> 0x11));
  Round(e,uVar13,uVar12,&h,a,uVar15,uVar52,&d,uVar24 + 0x90befffa);
  uVar14 = d;
  uVar11 = h;
  uVar22 = (uVar23 >> 3 ^ (uVar23 * 0x4000 | uVar23 >> 0x12) ^ (uVar23 * 0x2000000 | uVar23 >> 7)) +
           uVar58 + uVar22 +
           (uVar43 >> 10 ^ (uVar43 * 0x2000 | uVar43 >> 0x13) ^ (uVar43 * 0x8000 | uVar43 >> 0x11));
  Round(d,uVar51,uVar13,&g,h,uVar16,uVar15,&c,uVar22 + 0xa4506ceb);
  uVar52 = c;
  uVar12 = g;
  Round(c,uVar14,uVar51,&f,g,uVar11,uVar16,&b,
        (uVar27 >> 3 ^ (uVar27 * 0x4000 | uVar27 >> 0x12) ^ (uVar27 * 0x2000000 | uVar27 >> 7)) +
        uVar23 + uVar25 + -0x41065c09 +
        (uVar24 >> 10 ^ (uVar24 * 0x2000 | uVar24 >> 0x13) ^ (uVar24 * 0x8000 | uVar24 >> 0x11)));
  uVar51 = b;
  uVar13 = f;
  Round(b,uVar52,uVar14,&e,f,uVar12,uVar11,&a,
        (uVar49 >> 3 ^ (uVar49 * 0x4000 | uVar49 >> 0x12) ^ (uVar49 * 0x2000000 | uVar49 >> 7)) +
        uVar27 + uVar26 + -0x398e870e +
        (uVar22 >> 10 ^ (uVar22 * 0x2000 | uVar22 >> 0x13) ^ (uVar22 * 0x8000 | uVar22 >> 0x11)));
  WriteBE32(out,a + 0x6a09e667);
  WriteBE32(out + 4,uVar51 + 0xbb67ae85);
  WriteBE32(out + 8,uVar52 + 0x3c6ef372);
  WriteBE32(out + 0xc,uVar14 + 0xa54ff53a);
  WriteBE32(out + 0x10,e + 0x510e527f);
  WriteBE32(out + 0x14,uVar13 + 0x9b05688c);
  WriteBE32(out + 0x18,uVar12 + 0x1f83d9ab);
  WriteBE32(out + 0x1c,uVar11 + 0x5be0cd19);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TransformD64(unsigned char* out, const unsigned char* in)
{
    // Transform 1
    uint32_t a = 0x6a09e667ul;
    uint32_t b = 0xbb67ae85ul;
    uint32_t c = 0x3c6ef372ul;
    uint32_t d = 0xa54ff53aul;
    uint32_t e = 0x510e527ful;
    uint32_t f = 0x9b05688cul;
    uint32_t g = 0x1f83d9abul;
    uint32_t h = 0x5be0cd19ul;

    uint32_t w0, w1, w2, w3, w4, w5, w6, w7, w8, w9, w10, w11, w12, w13, w14, w15;

    Round(a, b, c, d, e, f, g, h, 0x428a2f98ul + (w0 = ReadBE32(in + 0)));
    Round(h, a, b, c, d, e, f, g, 0x71374491ul + (w1 = ReadBE32(in + 4)));
    Round(g, h, a, b, c, d, e, f, 0xb5c0fbcful + (w2 = ReadBE32(in + 8)));
    Round(f, g, h, a, b, c, d, e, 0xe9b5dba5ul + (w3 = ReadBE32(in + 12)));
    Round(e, f, g, h, a, b, c, d, 0x3956c25bul + (w4 = ReadBE32(in + 16)));
    Round(d, e, f, g, h, a, b, c, 0x59f111f1ul + (w5 = ReadBE32(in + 20)));
    Round(c, d, e, f, g, h, a, b, 0x923f82a4ul + (w6 = ReadBE32(in + 24)));
    Round(b, c, d, e, f, g, h, a, 0xab1c5ed5ul + (w7 = ReadBE32(in + 28)));
    Round(a, b, c, d, e, f, g, h, 0xd807aa98ul + (w8 = ReadBE32(in + 32)));
    Round(h, a, b, c, d, e, f, g, 0x12835b01ul + (w9 = ReadBE32(in + 36)));
    Round(g, h, a, b, c, d, e, f, 0x243185beul + (w10 = ReadBE32(in + 40)));
    Round(f, g, h, a, b, c, d, e, 0x550c7dc3ul + (w11 = ReadBE32(in + 44)));
    Round(e, f, g, h, a, b, c, d, 0x72be5d74ul + (w12 = ReadBE32(in + 48)));
    Round(d, e, f, g, h, a, b, c, 0x80deb1feul + (w13 = ReadBE32(in + 52)));
    Round(c, d, e, f, g, h, a, b, 0x9bdc06a7ul + (w14 = ReadBE32(in + 56)));
    Round(b, c, d, e, f, g, h, a, 0xc19bf174ul + (w15 = ReadBE32(in + 60)));
    Round(a, b, c, d, e, f, g, h, 0xe49b69c1ul + (w0 += sigma1(w14) + w9 + sigma0(w1)));
    Round(h, a, b, c, d, e, f, g, 0xefbe4786ul + (w1 += sigma1(w15) + w10 + sigma0(w2)));
    Round(g, h, a, b, c, d, e, f, 0x0fc19dc6ul + (w2 += sigma1(w0) + w11 + sigma0(w3)));
    Round(f, g, h, a, b, c, d, e, 0x240ca1ccul + (w3 += sigma1(w1) + w12 + sigma0(w4)));
    Round(e, f, g, h, a, b, c, d, 0x2de92c6ful + (w4 += sigma1(w2) + w13 + sigma0(w5)));
    Round(d, e, f, g, h, a, b, c, 0x4a7484aaul + (w5 += sigma1(w3) + w14 + sigma0(w6)));
    Round(c, d, e, f, g, h, a, b, 0x5cb0a9dcul + (w6 += sigma1(w4) + w15 + sigma0(w7)));
    Round(b, c, d, e, f, g, h, a, 0x76f988daul + (w7 += sigma1(w5) + w0 + sigma0(w8)));
    Round(a, b, c, d, e, f, g, h, 0x983e5152ul + (w8 += sigma1(w6) + w1 + sigma0(w9)));
    Round(h, a, b, c, d, e, f, g, 0xa831c66dul + (w9 += sigma1(w7) + w2 + sigma0(w10)));
    Round(g, h, a, b, c, d, e, f, 0xb00327c8ul + (w10 += sigma1(w8) + w3 + sigma0(w11)));
    Round(f, g, h, a, b, c, d, e, 0xbf597fc7ul + (w11 += sigma1(w9) + w4 + sigma0(w12)));
    Round(e, f, g, h, a, b, c, d, 0xc6e00bf3ul + (w12 += sigma1(w10) + w5 + sigma0(w13)));
    Round(d, e, f, g, h, a, b, c, 0xd5a79147ul + (w13 += sigma1(w11) + w6 + sigma0(w14)));
    Round(c, d, e, f, g, h, a, b, 0x06ca6351ul + (w14 += sigma1(w12) + w7 + sigma0(w15)));
    Round(b, c, d, e, f, g, h, a, 0x14292967ul + (w15 += sigma1(w13) + w8 + sigma0(w0)));
    Round(a, b, c, d, e, f, g, h, 0x27b70a85ul + (w0 += sigma1(w14) + w9 + sigma0(w1)));
    Round(h, a, b, c, d, e, f, g, 0x2e1b2138ul + (w1 += sigma1(w15) + w10 + sigma0(w2)));
    Round(g, h, a, b, c, d, e, f, 0x4d2c6dfcul + (w2 += sigma1(w0) + w11 + sigma0(w3)));
    Round(f, g, h, a, b, c, d, e, 0x53380d13ul + (w3 += sigma1(w1) + w12 + sigma0(w4)));
    Round(e, f, g, h, a, b, c, d, 0x650a7354ul + (w4 += sigma1(w2) + w13 + sigma0(w5)));
    Round(d, e, f, g, h, a, b, c, 0x766a0abbul + (w5 += sigma1(w3) + w14 + sigma0(w6)));
    Round(c, d, e, f, g, h, a, b, 0x81c2c92eul + (w6 += sigma1(w4) + w15 + sigma0(w7)));
    Round(b, c, d, e, f, g, h, a, 0x92722c85ul + (w7 += sigma1(w5) + w0 + sigma0(w8)));
    Round(a, b, c, d, e, f, g, h, 0xa2bfe8a1ul + (w8 += sigma1(w6) + w1 + sigma0(w9)));
    Round(h, a, b, c, d, e, f, g, 0xa81a664bul + (w9 += sigma1(w7) + w2 + sigma0(w10)));
    Round(g, h, a, b, c, d, e, f, 0xc24b8b70ul + (w10 += sigma1(w8) + w3 + sigma0(w11)));
    Round(f, g, h, a, b, c, d, e, 0xc76c51a3ul + (w11 += sigma1(w9) + w4 + sigma0(w12)));
    Round(e, f, g, h, a, b, c, d, 0xd192e819ul + (w12 += sigma1(w10) + w5 + sigma0(w13)));
    Round(d, e, f, g, h, a, b, c, 0xd6990624ul + (w13 += sigma1(w11) + w6 + sigma0(w14)));
    Round(c, d, e, f, g, h, a, b, 0xf40e3585ul + (w14 += sigma1(w12) + w7 + sigma0(w15)));
    Round(b, c, d, e, f, g, h, a, 0x106aa070ul + (w15 += sigma1(w13) + w8 + sigma0(w0)));
    Round(a, b, c, d, e, f, g, h, 0x19a4c116ul + (w0 += sigma1(w14) + w9 + sigma0(w1)));
    Round(h, a, b, c, d, e, f, g, 0x1e376c08ul + (w1 += sigma1(w15) + w10 + sigma0(w2)));
    Round(g, h, a, b, c, d, e, f, 0x2748774cul + (w2 += sigma1(w0) + w11 + sigma0(w3)));
    Round(f, g, h, a, b, c, d, e, 0x34b0bcb5ul + (w3 += sigma1(w1) + w12 + sigma0(w4)));
    Round(e, f, g, h, a, b, c, d, 0x391c0cb3ul + (w4 += sigma1(w2) + w13 + sigma0(w5)));
    Round(d, e, f, g, h, a, b, c, 0x4ed8aa4aul + (w5 += sigma1(w3) + w14 + sigma0(w6)));
    Round(c, d, e, f, g, h, a, b, 0x5b9cca4ful + (w6 += sigma1(w4) + w15 + sigma0(w7)));
    Round(b, c, d, e, f, g, h, a, 0x682e6ff3ul + (w7 += sigma1(w5) + w0 + sigma0(w8)));
    Round(a, b, c, d, e, f, g, h, 0x748f82eeul + (w8 += sigma1(w6) + w1 + sigma0(w9)));
    Round(h, a, b, c, d, e, f, g, 0x78a5636ful + (w9 += sigma1(w7) + w2 + sigma0(w10)));
    Round(g, h, a, b, c, d, e, f, 0x84c87814ul + (w10 += sigma1(w8) + w3 + sigma0(w11)));
    Round(f, g, h, a, b, c, d, e, 0x8cc70208ul + (w11 += sigma1(w9) + w4 + sigma0(w12)));
    Round(e, f, g, h, a, b, c, d, 0x90befffaul + (w12 += sigma1(w10) + w5 + sigma0(w13)));
    Round(d, e, f, g, h, a, b, c, 0xa4506cebul + (w13 += sigma1(w11) + w6 + sigma0(w14)));
    Round(c, d, e, f, g, h, a, b, 0xbef9a3f7ul + (w14 + sigma1(w12) + w7 + sigma0(w15)));
    Round(b, c, d, e, f, g, h, a, 0xc67178f2ul + (w15 + sigma1(w13) + w8 + sigma0(w0)));

    a += 0x6a09e667ul;
    b += 0xbb67ae85ul;
    c += 0x3c6ef372ul;
    d += 0xa54ff53aul;
    e += 0x510e527ful;
    f += 0x9b05688cul;
    g += 0x1f83d9abul;
    h += 0x5be0cd19ul;

    uint32_t t0 = a, t1 = b, t2 = c, t3 = d, t4 = e, t5 = f, t6 = g, t7 = h;

    // Transform 2
    Round(a, b, c, d, e, f, g, h, 0xc28a2f98ul);
    Round(h, a, b, c, d, e, f, g, 0x71374491ul);
    Round(g, h, a, b, c, d, e, f, 0xb5c0fbcful);
    Round(f, g, h, a, b, c, d, e, 0xe9b5dba5ul);
    Round(e, f, g, h, a, b, c, d, 0x3956c25bul);
    Round(d, e, f, g, h, a, b, c, 0x59f111f1ul);
    Round(c, d, e, f, g, h, a, b, 0x923f82a4ul);
    Round(b, c, d, e, f, g, h, a, 0xab1c5ed5ul);
    Round(a, b, c, d, e, f, g, h, 0xd807aa98ul);
    Round(h, a, b, c, d, e, f, g, 0x12835b01ul);
    Round(g, h, a, b, c, d, e, f, 0x243185beul);
    Round(f, g, h, a, b, c, d, e, 0x550c7dc3ul);
    Round(e, f, g, h, a, b, c, d, 0x72be5d74ul);
    Round(d, e, f, g, h, a, b, c, 0x80deb1feul);
    Round(c, d, e, f, g, h, a, b, 0x9bdc06a7ul);
    Round(b, c, d, e, f, g, h, a, 0xc19bf374ul);
    Round(a, b, c, d, e, f, g, h, 0x649b69c1ul);
    Round(h, a, b, c, d, e, f, g, 0xf0fe4786ul);
    Round(g, h, a, b, c, d, e, f, 0x0fe1edc6ul);
    Round(f, g, h, a, b, c, d, e, 0x240cf254ul);
    Round(e, f, g, h, a, b, c, d, 0x4fe9346ful);
    Round(d, e, f, g, h, a, b, c, 0x6cc984beul);
    Round(c, d, e, f, g, h, a, b, 0x61b9411eul);
    Round(b, c, d, e, f, g, h, a, 0x16f988faul);
    Round(a, b, c, d, e, f, g, h, 0xf2c65152ul);
    Round(h, a, b, c, d, e, f, g, 0xa88e5a6dul);
    Round(g, h, a, b, c, d, e, f, 0xb019fc65ul);
    Round(f, g, h, a, b, c, d, e, 0xb9d99ec7ul);
    Round(e, f, g, h, a, b, c, d, 0x9a1231c3ul);
    Round(d, e, f, g, h, a, b, c, 0xe70eeaa0ul);
    Round(c, d, e, f, g, h, a, b, 0xfdb1232bul);
    Round(b, c, d, e, f, g, h, a, 0xc7353eb0ul);
    Round(a, b, c, d, e, f, g, h, 0x3069bad5ul);
    Round(h, a, b, c, d, e, f, g, 0xcb976d5ful);
    Round(g, h, a, b, c, d, e, f, 0x5a0f118ful);
    Round(f, g, h, a, b, c, d, e, 0xdc1eeefdul);
    Round(e, f, g, h, a, b, c, d, 0x0a35b689ul);
    Round(d, e, f, g, h, a, b, c, 0xde0b7a04ul);
    Round(c, d, e, f, g, h, a, b, 0x58f4ca9dul);
    Round(b, c, d, e, f, g, h, a, 0xe15d5b16ul);
    Round(a, b, c, d, e, f, g, h, 0x007f3e86ul);
    Round(h, a, b, c, d, e, f, g, 0x37088980ul);
    Round(g, h, a, b, c, d, e, f, 0xa507ea32ul);
    Round(f, g, h, a, b, c, d, e, 0x6fab9537ul);
    Round(e, f, g, h, a, b, c, d, 0x17406110ul);
    Round(d, e, f, g, h, a, b, c, 0x0d8cd6f1ul);
    Round(c, d, e, f, g, h, a, b, 0xcdaa3b6dul);
    Round(b, c, d, e, f, g, h, a, 0xc0bbbe37ul);
    Round(a, b, c, d, e, f, g, h, 0x83613bdaul);
    Round(h, a, b, c, d, e, f, g, 0xdb48a363ul);
    Round(g, h, a, b, c, d, e, f, 0x0b02e931ul);
    Round(f, g, h, a, b, c, d, e, 0x6fd15ca7ul);
    Round(e, f, g, h, a, b, c, d, 0x521afacaul);
    Round(d, e, f, g, h, a, b, c, 0x31338431ul);
    Round(c, d, e, f, g, h, a, b, 0x6ed41a95ul);
    Round(b, c, d, e, f, g, h, a, 0x6d437890ul);
    Round(a, b, c, d, e, f, g, h, 0xc39c91f2ul);
    Round(h, a, b, c, d, e, f, g, 0x9eccabbdul);
    Round(g, h, a, b, c, d, e, f, 0xb5c9a0e6ul);
    Round(f, g, h, a, b, c, d, e, 0x532fb63cul);
    Round(e, f, g, h, a, b, c, d, 0xd2c741c6ul);
    Round(d, e, f, g, h, a, b, c, 0x07237ea3ul);
    Round(c, d, e, f, g, h, a, b, 0xa4954b68ul);
    Round(b, c, d, e, f, g, h, a, 0x4c191d76ul);

    w0 = t0 + a;
    w1 = t1 + b;
    w2 = t2 + c;
    w3 = t3 + d;
    w4 = t4 + e;
    w5 = t5 + f;
    w6 = t6 + g;
    w7 = t7 + h;

    // Transform 3
    a = 0x6a09e667ul;
    b = 0xbb67ae85ul;
    c = 0x3c6ef372ul;
    d = 0xa54ff53aul;
    e = 0x510e527ful;
    f = 0x9b05688cul;
    g = 0x1f83d9abul;
    h = 0x5be0cd19ul;

    Round(a, b, c, d, e, f, g, h, 0x428a2f98ul + w0);
    Round(h, a, b, c, d, e, f, g, 0x71374491ul + w1);
    Round(g, h, a, b, c, d, e, f, 0xb5c0fbcful + w2);
    Round(f, g, h, a, b, c, d, e, 0xe9b5dba5ul + w3);
    Round(e, f, g, h, a, b, c, d, 0x3956c25bul + w4);
    Round(d, e, f, g, h, a, b, c, 0x59f111f1ul + w5);
    Round(c, d, e, f, g, h, a, b, 0x923f82a4ul + w6);
    Round(b, c, d, e, f, g, h, a, 0xab1c5ed5ul + w7);
    Round(a, b, c, d, e, f, g, h, 0x5807aa98ul);
    Round(h, a, b, c, d, e, f, g, 0x12835b01ul);
    Round(g, h, a, b, c, d, e, f, 0x243185beul);
    Round(f, g, h, a, b, c, d, e, 0x550c7dc3ul);
    Round(e, f, g, h, a, b, c, d, 0x72be5d74ul);
    Round(d, e, f, g, h, a, b, c, 0x80deb1feul);
    Round(c, d, e, f, g, h, a, b, 0x9bdc06a7ul);
    Round(b, c, d, e, f, g, h, a, 0xc19bf274ul);
    Round(a, b, c, d, e, f, g, h, 0xe49b69c1ul + (w0 += sigma0(w1)));
    Round(h, a, b, c, d, e, f, g, 0xefbe4786ul + (w1 += 0xa00000ul + sigma0(w2)));
    Round(g, h, a, b, c, d, e, f, 0x0fc19dc6ul + (w2 += sigma1(w0) + sigma0(w3)));
    Round(f, g, h, a, b, c, d, e, 0x240ca1ccul + (w3 += sigma1(w1) + sigma0(w4)));
    Round(e, f, g, h, a, b, c, d, 0x2de92c6ful + (w4 += sigma1(w2) + sigma0(w5)));
    Round(d, e, f, g, h, a, b, c, 0x4a7484aaul + (w5 += sigma1(w3) + sigma0(w6)));
    Round(c, d, e, f, g, h, a, b, 0x5cb0a9dcul + (w6 += sigma1(w4) + 0x100ul + sigma0(w7)));
    Round(b, c, d, e, f, g, h, a, 0x76f988daul + (w7 += sigma1(w5) + w0 + 0x11002000ul));
    Round(a, b, c, d, e, f, g, h, 0x983e5152ul + (w8 = 0x80000000ul + sigma1(w6) + w1));
    Round(h, a, b, c, d, e, f, g, 0xa831c66dul + (w9 = sigma1(w7) + w2));
    Round(g, h, a, b, c, d, e, f, 0xb00327c8ul + (w10 = sigma1(w8) + w3));
    Round(f, g, h, a, b, c, d, e, 0xbf597fc7ul + (w11 = sigma1(w9) + w4));
    Round(e, f, g, h, a, b, c, d, 0xc6e00bf3ul + (w12 = sigma1(w10) + w5));
    Round(d, e, f, g, h, a, b, c, 0xd5a79147ul + (w13 = sigma1(w11) + w6));
    Round(c, d, e, f, g, h, a, b, 0x06ca6351ul + (w14 = sigma1(w12) + w7 + 0x400022ul));
    Round(b, c, d, e, f, g, h, a, 0x14292967ul + (w15 = 0x100ul + sigma1(w13) + w8 + sigma0(w0)));
    Round(a, b, c, d, e, f, g, h, 0x27b70a85ul + (w0 += sigma1(w14) + w9 + sigma0(w1)));
    Round(h, a, b, c, d, e, f, g, 0x2e1b2138ul + (w1 += sigma1(w15) + w10 + sigma0(w2)));
    Round(g, h, a, b, c, d, e, f, 0x4d2c6dfcul + (w2 += sigma1(w0) + w11 + sigma0(w3)));
    Round(f, g, h, a, b, c, d, e, 0x53380d13ul + (w3 += sigma1(w1) + w12 + sigma0(w4)));
    Round(e, f, g, h, a, b, c, d, 0x650a7354ul + (w4 += sigma1(w2) + w13 + sigma0(w5)));
    Round(d, e, f, g, h, a, b, c, 0x766a0abbul + (w5 += sigma1(w3) + w14 + sigma0(w6)));
    Round(c, d, e, f, g, h, a, b, 0x81c2c92eul + (w6 += sigma1(w4) + w15 + sigma0(w7)));
    Round(b, c, d, e, f, g, h, a, 0x92722c85ul + (w7 += sigma1(w5) + w0 + sigma0(w8)));
    Round(a, b, c, d, e, f, g, h, 0xa2bfe8a1ul + (w8 += sigma1(w6) + w1 + sigma0(w9)));
    Round(h, a, b, c, d, e, f, g, 0xa81a664bul + (w9 += sigma1(w7) + w2 + sigma0(w10)));
    Round(g, h, a, b, c, d, e, f, 0xc24b8b70ul + (w10 += sigma1(w8) + w3 + sigma0(w11)));
    Round(f, g, h, a, b, c, d, e, 0xc76c51a3ul + (w11 += sigma1(w9) + w4 + sigma0(w12)));
    Round(e, f, g, h, a, b, c, d, 0xd192e819ul + (w12 += sigma1(w10) + w5 + sigma0(w13)));
    Round(d, e, f, g, h, a, b, c, 0xd6990624ul + (w13 += sigma1(w11) + w6 + sigma0(w14)));
    Round(c, d, e, f, g, h, a, b, 0xf40e3585ul + (w14 += sigma1(w12) + w7 + sigma0(w15)));
    Round(b, c, d, e, f, g, h, a, 0x106aa070ul + (w15 += sigma1(w13) + w8 + sigma0(w0)));
    Round(a, b, c, d, e, f, g, h, 0x19a4c116ul + (w0 += sigma1(w14) + w9 + sigma0(w1)));
    Round(h, a, b, c, d, e, f, g, 0x1e376c08ul + (w1 += sigma1(w15) + w10 + sigma0(w2)));
    Round(g, h, a, b, c, d, e, f, 0x2748774cul + (w2 += sigma1(w0) + w11 + sigma0(w3)));
    Round(f, g, h, a, b, c, d, e, 0x34b0bcb5ul + (w3 += sigma1(w1) + w12 + sigma0(w4)));
    Round(e, f, g, h, a, b, c, d, 0x391c0cb3ul + (w4 += sigma1(w2) + w13 + sigma0(w5)));
    Round(d, e, f, g, h, a, b, c, 0x4ed8aa4aul + (w5 += sigma1(w3) + w14 + sigma0(w6)));
    Round(c, d, e, f, g, h, a, b, 0x5b9cca4ful + (w6 += sigma1(w4) + w15 + sigma0(w7)));
    Round(b, c, d, e, f, g, h, a, 0x682e6ff3ul + (w7 += sigma1(w5) + w0 + sigma0(w8)));
    Round(a, b, c, d, e, f, g, h, 0x748f82eeul + (w8 += sigma1(w6) + w1 + sigma0(w9)));
    Round(h, a, b, c, d, e, f, g, 0x78a5636ful + (w9 += sigma1(w7) + w2 + sigma0(w10)));
    Round(g, h, a, b, c, d, e, f, 0x84c87814ul + (w10 += sigma1(w8) + w3 + sigma0(w11)));
    Round(f, g, h, a, b, c, d, e, 0x8cc70208ul + (w11 += sigma1(w9) + w4 + sigma0(w12)));
    Round(e, f, g, h, a, b, c, d, 0x90befffaul + (w12 += sigma1(w10) + w5 + sigma0(w13)));
    Round(d, e, f, g, h, a, b, c, 0xa4506cebul + (w13 += sigma1(w11) + w6 + sigma0(w14)));
    Round(c, d, e, f, g, h, a, b, 0xbef9a3f7ul + (w14 + sigma1(w12) + w7 + sigma0(w15)));
    Round(b, c, d, e, f, g, h, a, 0xc67178f2ul + (w15 + sigma1(w13) + w8 + sigma0(w0)));

    // Output
    WriteBE32(out + 0, a + 0x6a09e667ul);
    WriteBE32(out + 4, b + 0xbb67ae85ul);
    WriteBE32(out + 8, c + 0x3c6ef372ul);
    WriteBE32(out + 12, d + 0xa54ff53aul);
    WriteBE32(out + 16, e + 0x510e527ful);
    WriteBE32(out + 20, f + 0x9b05688cul);
    WriteBE32(out + 24, g + 0x1f83d9abul);
    WriteBE32(out + 28, h + 0x5be0cd19ul);
}